

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> *
split<int>(vector<int,_std::allocator<int>_> *__return_storage_ptr__,string *s,char delim,
          function<int_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *transform)

{
  pointer pcVar1;
  iterator __position;
  pointer piVar2;
  int iVar3;
  istream *piVar4;
  undefined8 uVar5;
  long lVar6;
  pointer pcVar7;
  pointer pcVar8;
  string item;
  stringstream ss;
  int local_1fc;
  undefined1 *local_1f8;
  long local_1f0;
  undefined1 local_1e8;
  undefined7 uStack_1e7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  pcVar1 = (s->_M_dataplus)._M_p;
  pcVar8 = pcVar1 + s->_M_string_length;
  lVar6 = (long)s->_M_string_length >> 2;
  pcVar7 = pcVar8;
  if (0 < lVar6) {
    pcVar7 = pcVar8 + lVar6 * -4;
    lVar6 = lVar6 + 1;
    do {
      iVar3 = isspace((int)pcVar8[-1]);
      if (iVar3 == 0) goto LAB_00115b15;
      iVar3 = isspace((int)pcVar8[-2]);
      if (iVar3 == 0) {
        pcVar8 = pcVar8 + -1;
        goto LAB_00115b15;
      }
      iVar3 = isspace((int)pcVar8[-3]);
      if (iVar3 == 0) {
        pcVar8 = pcVar8 + -2;
        goto LAB_00115b15;
      }
      iVar3 = isspace((int)pcVar8[-4]);
      if (iVar3 == 0) {
        pcVar8 = pcVar8 + -3;
        goto LAB_00115b15;
      }
      pcVar8 = pcVar8 + -4;
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
  }
  lVar6 = (long)pcVar7 - (long)pcVar1;
  if (lVar6 != 1) {
    pcVar8 = pcVar7;
    if (lVar6 != 2) {
      pcVar8 = pcVar1;
      if ((lVar6 != 3) || (iVar3 = isspace((int)pcVar7[-1]), pcVar8 = pcVar7, iVar3 == 0))
      goto LAB_00115b15;
      pcVar8 = pcVar7 + -1;
    }
    iVar3 = isspace((int)pcVar8[-1]);
    if (iVar3 == 0) goto LAB_00115b15;
    pcVar7 = pcVar8 + -1;
  }
  iVar3 = isspace((int)pcVar7[-1]);
  pcVar8 = pcVar7;
  if (iVar3 != 0) {
    pcVar8 = pcVar1;
  }
LAB_00115b15:
  s->_M_string_length = (long)pcVar8 - (long)pcVar1;
  *pcVar8 = '\0';
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::stringstream::stringstream(local_1b8,(string *)s,_S_out|_S_in);
  local_1f8 = &local_1e8;
  local_1f0 = 0;
  local_1e8 = 0;
  while( true ) {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1b8,(string *)&local_1f8,delim);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
      if (local_1f8 != &local_1e8) {
        operator_delete(local_1f8,CONCAT71(uStack_1e7,local_1e8) + 1);
      }
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      return __return_storage_ptr__;
    }
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_1d8,local_1f8,local_1f8 + local_1f0);
    if ((transform->super__Function_base)._M_manager == (_Manager_type)0x0) break;
    local_1fc = (*transform->_M_invoker)((_Any_data *)transform,&local_1d8);
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (__return_storage_ptr__,__position,&local_1fc);
    }
    else {
      *__position._M_current = local_1fc;
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
  }
  uVar5 = std::__throw_bad_function_call();
  piVar2 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(__return_storage_ptr__->
                                 super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  _Unwind_Resume(uVar5);
}

Assistant:

std::vector<t> split(std::string& s, char delim, const std::function<t(std::string)>& transform) {
	trim(s);
	std::vector<t> elems;
	std::stringstream ss(s);
	std::string item;
	while (std::getline(ss, item, delim)){ elems.push_back(transform(item)); }
	return elems;
}